

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK4.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::RK4::oneStepIntegration
          (RK4 *this,double t0,double dT,VectorDynSize *x0,VectorDynSize *x)

{
  MatrixXd *pMVar1;
  element_type *peVar2;
  int iVar3;
  string *psVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  LhsNested pMVar8;
  RhsNested pMVar9;
  non_const_type pSVar10;
  ulong uVar11;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> buffer_map;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x_map;
  non_const_type local_e0;
  RhsNested pMStack_d8;
  undefined1 local_d0;
  non_const_type local_c8;
  VectorDynSize *local_c0;
  double local_b8;
  VectorDynSize *local_b0;
  undefined1 local_a8 [24];
  non_const_type local_90;
  variable_if_dynamic<long,__1> vStack_88;
  variable_if_dynamic<long,__1> vStack_80;
  scalar_constant_op<double> local_78;
  variable_if_dynamic<long,__1> local_70;
  RhsNested pMStack_68;
  undefined1 local_60;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  local_b8 = t0;
  if ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    psVar4 = IntegratorInfo::name_abi_cxx11_
                       (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    iDynTree::reportError
              ((psVar4->_M_dataplus)._M_p,"oneStepIntegration","Dynamical system not set.");
  }
  sVar5 = iDynTree::VectorDynSize::size();
  sVar6 = DynamicalSystem::stateSpaceSize
                    ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (sVar5 != sVar6) {
    DynamicalSystem::stateSpaceSize
              ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
               super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    iDynTree::VectorDynSize::resize((ulong)x);
  }
  uVar7 = iDynTree::VectorDynSize::data();
  local_b0 = x;
  local_48._8_8_ = iDynTree::VectorDynSize::size();
  local_48._0_8_ = uVar7;
  pMVar8 = (LhsNested)iDynTree::VectorDynSize::data();
  pMVar9 = (RhsNested)iDynTree::VectorDynSize::size();
  pSVar10 = (non_const_type)iDynTree::VectorDynSize::data();
  local_c0 = &this->m_computationBuffer;
  pMStack_d8 = (RhsNested)iDynTree::VectorDynSize::size();
  pMVar1 = &this->m_K;
  local_c8 = &this->m_aCoefficents;
  local_e0 = pSVar10;
  for (uVar11 = 0; local_a8._0_8_ = pMVar1, uVar11 != 4; uVar11 = uVar11 + 1) {
    local_70.m_value = (this->m_aCoefficents).m_outerSize;
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    local_a8[0x10] = false;
    local_90 = local_c8;
    vStack_80.m_value = 0;
    vStack_88.m_value = uVar11;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,0,int>,1,_1,false>>,0>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_e0,
               (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_>,_0>
                *)local_a8);
    local_a8._8_8_ = pMStack_d8;
    local_78.m_other._0_1_ = local_d0;
    vStack_88.m_value = (long)local_e0;
    vStack_80.m_value = (long)pMStack_d8;
    local_90 = (non_const_type)dT;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_e0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_a8);
    vStack_80.m_value._0_1_ = local_d0;
    local_90 = local_e0;
    vStack_88.m_value = (long)pMStack_d8;
    local_a8._0_8_ = pMVar8;
    local_a8._8_8_ = pMVar9;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
              (&local_48,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_a8);
    peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
             super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar3 = (*peVar2->_vptr_DynamicalSystem[2])
                      (SUB84((this->m_cCoefficients).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[uVar11] * dT + local_b8,0),peVar2,local_b0,local_c0);
    if ((char)iVar3 == '\0') goto LAB_001a57f9;
    local_a8._8_8_ =
         (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
    local_a8._0_8_ =
         (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data + local_a8._8_8_ * uVar11;
    vStack_88.m_value = 0;
    local_90 = (non_const_type)pMVar1;
    vStack_80.m_value = uVar11;
    local_78.m_other = (double)local_a8._8_8_;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_a8,
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_e0);
  }
  local_a8._8_8_ = &this->m_bCoefficients;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_e0,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)local_a8);
  local_70.m_value = (long)local_e0;
  pMStack_68 = pMStack_d8;
  local_60 = local_d0;
  vStack_88.m_value = (long)pMStack_d8;
  local_a8._0_8_ = pMVar8;
  local_a8._8_8_ = pMVar9;
  local_78.m_other = dT;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const>>
            (&local_48,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)local_a8);
LAB_001a57f9:
  return 3 < uVar11;
}

Assistant:

bool RK4::oneStepIntegration(double t0, double dT, const VectorDynSize &x0, VectorDynSize &x){
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Dynamical system not set.");
                }

                if (x.size() != m_dynamicalSystem_ptr->stateSpaceSize()) {
                    x.resize(m_dynamicalSystem_ptr->stateSpaceSize());
                }

                Eigen::Map<Eigen::VectorXd> x_map(x.data(), x.size());
                const Eigen::Map<const Eigen::VectorXd> x0_map(x0.data(), x0.size());
                Eigen::Map<Eigen::VectorXd> buffer_map(m_computationBuffer.data(), m_computationBuffer.size());
                bool ok;
                for (int i=0; i<4; ++i){
                    buffer_map = m_K * m_aCoefficents.row(i).transpose(); //use the x vector as buffer
                    buffer_map = dT*buffer_map;   //use the x vector as buffer
                    x_map = x0_map + buffer_map;
                    ok = m_dynamicalSystem_ptr->dynamics(x, t0 + m_cCoefficients(i)*dT, m_computationBuffer);
                    if(!ok){
                        return false;
                    }
                    m_K.col(i) = buffer_map;
                }

                buffer_map = m_K * m_bCoefficients;
                x_map = x0_map + dT * buffer_map;
                return true;
            }